

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  long lVar5;
  byte bVar6;
  StyledStreamWriter *this_00;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  AVar2 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (0 < (int)AVar2 && !bVar1) {
    iVar7 = 1;
    do {
      pVVar4 = Value::operator[](value,iVar7 + -1);
      bVar9 = bVar1 == false;
      bVar1 = true;
      if (bVar9) {
        bVar1 = Value::isArray(pVVar4);
        if ((bVar1) || (bVar1 = Value::isObject(pVVar4), bVar1)) {
          AVar3 = Value::size(pVVar4);
          bVar1 = AVar3 != 0;
        }
        else {
          bVar1 = false;
        }
      }
    } while ((iVar7 < (int)AVar2) && (iVar7 = iVar7 + 1, bVar1 == false));
  }
  if (bVar1 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar2);
    this->field_0x68 = this->field_0x68 | 1;
    iVar7 = AVar2 * 2 + 2;
    bVar6 = 0;
    if (0 < (int)AVar2) {
      lVar5 = 8;
      uVar8 = 0;
      do {
        this_00 = (StyledStreamWriter *)value;
        pVVar4 = Value::operator[](value,(int)uVar8);
        bVar1 = hasCommentForValue(this_00,pVVar4);
        if (bVar1) {
          bVar6 = 1;
        }
        pVVar4 = Value::operator[](value,(int)uVar8);
        writeValue(this,pVVar4);
        iVar7 = iVar7 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar5);
        uVar8 = uVar8 + 1;
        lVar5 = lVar5 + 0x20;
      } while (AVar2 != uVar8);
    }
    this->field_0x68 = this->field_0x68 & 0xfe;
    bVar1 = (bool)(this->rightMargin_ <= iVar7 | bVar6);
  }
  return bVar1;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}